

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfc.cpp
# Opt level: O3

void __thiscall NfcFilter::adjust(NfcFilter *this,float w0)

{
  float fVar1;
  undefined4 in_XMM0_Db;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [12];
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [12];
  undefined1 auVar7 [16];
  
  fVar1 = w0 * 0.5;
  (this->first).gain = (this->first).base_gain * (fVar1 + 1.0);
  (this->first).b1 = (fVar1 + fVar1) / (fVar1 + 1.0);
  fVar5 = fVar1 * 3.0;
  auVar2._0_4_ = fVar5 + 1.0 + fVar1 * fVar5;
  (this->second).gain = (this->second).base_gain * auVar2._0_4_;
  fVar9 = fVar1 * fVar5 * 4.0;
  auVar6._0_4_ = fVar5 + fVar5 + fVar9;
  auVar7._4_8_ = 0;
  auVar7._0_4_ = auVar6._0_4_;
  auVar7._12_4_ = in_XMM0_Db;
  auVar6._8_8_ = auVar7._8_8_;
  auVar6._4_4_ = fVar9;
  auVar2._4_4_ = auVar2._0_4_;
  auVar2._8_8_ = 0;
  auVar8 = divps(auVar6,auVar2);
  (this->second).b1 = (float)(int)auVar8._0_8_;
  (this->second).b2 = (float)(int)((ulong)auVar8._0_8_ >> 0x20);
  fVar5 = fVar1 * 3.6778;
  fVar9 = fVar1 * 6.4595 * fVar1;
  fVar10 = fVar1 * 2.3222;
  auVar13._0_4_ = fVar10 + 1.0;
  auVar13._4_4_ = fVar9 + fVar5 + 1.0;
  auVar13._8_4_ = auVar13._4_4_;
  auVar13._12_4_ = auVar13._0_4_;
  fVar9 = fVar9 * 4.0;
  auVar3._0_4_ = fVar5 + fVar5 + fVar9;
  auVar3._4_4_ = auVar3._0_4_;
  auVar3._8_4_ = fVar9;
  auVar3._12_4_ = fVar10 + fVar10;
  auVar8 = divps(auVar3,auVar13);
  auVar4 = auVar8._4_12_;
  (this->third).gain = auVar13._4_4_ * (this->third).base_gain * auVar13._0_4_;
  (this->third).b1 = (float)auVar4._0_4_;
  (this->third).b2 = (float)auVar4._4_4_;
  (this->third).b3 = (float)auVar4._8_4_;
  fVar9 = fVar1 * 5.7924;
  fVar10 = fVar1 * 4.2076;
  fVar5 = fVar1 * 9.1401 * fVar1;
  fVar1 = fVar1 * 11.4877 * fVar1;
  fVar11 = fVar9 + 1.0 + fVar5;
  fVar12 = fVar10 + 1.0 + fVar1;
  fVar5 = fVar5 * 4.0;
  fVar1 = fVar1 * 4.0;
  auVar14._0_4_ = fVar10 + fVar10 + fVar1;
  auVar14._4_4_ = auVar14._0_4_;
  auVar14._8_4_ = fVar1;
  auVar14._12_4_ = fVar9 + fVar9 + fVar5;
  auVar8._4_4_ = fVar12;
  auVar8._0_4_ = fVar11;
  auVar8._8_4_ = fVar12;
  auVar8._12_4_ = fVar11;
  auVar8 = divps(auVar14,auVar8);
  auVar15 = auVar8._4_12_;
  (this->fourth).gain = fVar12 * (this->fourth).base_gain * fVar11;
  (this->fourth).b1 = (float)auVar15._0_4_;
  (this->fourth).b2 = (float)auVar15._4_4_;
  (this->fourth).b3 = (float)auVar15._8_4_;
  (this->fourth).b4 = fVar5 / fVar11;
  return;
}

Assistant:

void NfcFilterAdjust1(NfcFilter1 *nfc, const float w0) noexcept
{
    const float r{0.5f * w0};
    const float b_00{B[1][0] * r};
    const float g_0{1.0f + b_00};

    nfc->gain = nfc->base_gain * g_0;
    nfc->b1 = 2.0f * b_00 / g_0;
}